

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O2

RPCHelpMan * generate(void)

{
  string description;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff38 [16];
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  pointer in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 *in_stack_ffffffffffffff70;
  _Manager_type in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 *puVar4;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"generate",(allocator<char> *)&stack0xffffffffffffff6f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,
             "has been replaced by the -generate cli option. Refer to -help for more information.",
             (allocator<char> *)&stack0xffffffffffffff6e);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  RPCResults::RPCResults
            ((RPCResults *)&stack0xffffffffffffff30,(initializer_list<RPCResult>)ZEXT816(0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff70,"",(allocator<char> *)&stack0xffffffffffffff2f);
  puVar4 = &stack0xffffffffffffffa0;
  if (in_stack_ffffffffffffff70 != &stack0xffffffffffffff80) {
    puVar4 = in_stack_ffffffffffffff70;
  }
  fun._M_invoker._1_7_ = in_stack_ffffffffffffff81;
  fun._M_invoker._0_1_ = in_stack_ffffffffffffff80;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mining.cpp:255:147)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mining.cpp:255:147)>
                ::_M_manager;
  description.field_2 = in_stack_ffffffffffffff28;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffff38._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffff38._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pRVar3;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pRVar2;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff60;
  examples.m_examples.field_2._9_7_ = in_stack_ffffffffffffff81;
  examples.m_examples._0_25_ =
       ZEXT1625(CONCAT88(&stack0xffffffffffffff80,in_stack_ffffffffffffff68));
  fun.super__Function_base._M_functor._8_8_ = puVar4;
  fun.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff88;
  fun.super__Function_base._M_manager = in_stack_ffffffffffffff78;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffff00,&stack0xffffffffffffff08)),
             description,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff08);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff30);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffff48);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static RPCHelpMan generate()
{
    return RPCHelpMan{"generate", "has been replaced by the -generate cli option. Refer to -help for more information.", {}, {}, RPCExamples{""}, [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
        throw JSONRPCError(RPC_METHOD_NOT_FOUND, self.ToString());
    }};
}